

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O1

void highbd_interpolate(uint16_t *input,int in_length,uint16_t *output,int out_length,int bd)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  undefined1 auVar7 [14];
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint16_t uVar16;
  int iVar17;
  long lVar18;
  bool bVar19;
  int iVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar25 [16];
  int16_t (*local_48) [8];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined2 uVar26;
  
  if (out_length < in_length) {
    iVar8 = out_length * 0x10;
    if (iVar8 < in_length * 0xd) {
      if (iVar8 < in_length * 0xb) {
        local_48 = filteredinterp_filters625;
        if (SBORROW4(iVar8,in_length * 9) != iVar8 + in_length * -9 < 0) {
          local_48 = filteredinterp_filters500;
        }
      }
      else {
        local_48 = filteredinterp_filters750;
      }
    }
    else {
      local_48 = filteredinterp_filters875;
    }
  }
  else {
    local_48 = av1_resize_filter_normative;
  }
  iVar13 = out_length / 2;
  iVar10 = 0;
  uVar12 = (uint)(in_length * 0x4000 + iVar13) / (uint)out_length;
  iVar8 = -iVar13;
  if (in_length - out_length != 0 && out_length <= in_length) {
    iVar8 = iVar13;
  }
  iVar8 = ((in_length - out_length) * 0x2000 + iVar8) / out_length;
  uVar9 = iVar8 + 0x80;
  if (iVar8 < 0xbf80) {
    iVar10 = 0;
    uVar14 = uVar9;
    do {
      iVar10 = iVar10 + 1;
      uVar14 = uVar14 + uVar12;
    } while ((int)uVar14 < 0xc000);
  }
  iVar13 = out_length + -1;
  for (iVar8 = iVar8 + uVar12 * iVar13 + 0x80; in_length <= (iVar8 >> 0xe) + 4;
      iVar8 = iVar8 - uVar12) {
    iVar13 = iVar13 + -1;
  }
  if (iVar13 < iVar10) {
    if (0 < out_length) {
      iVar8 = 0;
      do {
        lVar11 = 0;
        iVar10 = 0;
        do {
          uVar14 = ((int)uVar9 >> 0xe) + -3 + (int)lVar11;
          if ((int)(in_length - 1U) <= (int)uVar14) {
            uVar14 = in_length - 1U;
          }
          if ((int)uVar14 < 1) {
            uVar14 = 0;
          }
          iVar10 = iVar10 + (uint)input[uVar14] *
                            (int)*(short *)((long)*local_48 +
                                           lVar11 * 2 + (ulong)(uVar9 >> 4 & 0x3f0));
          lVar11 = lVar11 + 1;
        } while (lVar11 != 8);
        uVar14 = iVar10 + 0x40 >> 7;
        if (bd == 10) {
          uVar15 = 0x3ff;
        }
        else if (bd == 0xc) {
          uVar15 = 0xfff;
        }
        else {
          uVar15 = 0xff;
        }
        if ((int)uVar15 <= (int)uVar14) {
          uVar14 = uVar15;
        }
        if ((int)uVar14 < 1) {
          uVar14 = 0;
        }
        *output = (uint16_t)uVar14;
        output = output + 1;
        iVar8 = iVar8 + 1;
        uVar9 = uVar9 + uVar12;
      } while (iVar8 != out_length);
    }
  }
  else {
    if (iVar10 == 0) {
      iVar10 = 0;
    }
    else {
      iVar8 = 0;
      do {
        lVar11 = 0;
        iVar17 = 0;
        do {
          uVar14 = ((int)uVar9 >> 0xe) + -3 + (int)lVar11;
          if ((int)uVar14 < 1) {
            uVar14 = 0;
          }
          iVar17 = iVar17 + (uint)input[uVar14] *
                            (int)*(short *)((long)*local_48 +
                                           lVar11 * 2 + (ulong)(uVar9 >> 4 & 0x3f0));
          lVar11 = lVar11 + 1;
        } while (lVar11 != 8);
        uVar14 = iVar17 + 0x40 >> 7;
        if (bd == 10) {
          if (0x3fe < (int)uVar14) {
            uVar14 = 0x3ff;
          }
        }
        else {
          if (bd == 0xc) {
            uVar15 = 0xfff;
          }
          else {
            uVar15 = 0xff;
          }
          if ((int)uVar15 <= (int)uVar14) {
            uVar14 = uVar15;
          }
        }
        if ((int)uVar14 < 1) {
          uVar14 = 0;
        }
        *output = (uint16_t)uVar14;
        output = output + 1;
        iVar8 = iVar8 + 1;
        uVar9 = uVar9 + uVar12;
      } while (iVar8 != iVar10);
    }
    if (iVar10 <= iVar13) {
      do {
        lVar18 = -3;
        lVar11 = 0;
        iVar8 = 0;
        iVar17 = 0;
        iVar20 = 0;
        iVar21 = 0;
        do {
          uVar1 = *(ulong *)((long)*local_48 + lVar11 * 2 + (ulong)(uVar9 >> 4 & 0x3f0));
          uVar26 = (undefined2)(uVar1 >> 0x30);
          auVar24._8_4_ = 0;
          auVar24._0_8_ = uVar1;
          auVar24._12_2_ = uVar26;
          auVar24._14_2_ = uVar26;
          uVar26 = (undefined2)(uVar1 >> 0x20);
          auVar23._12_4_ = auVar24._12_4_;
          auVar23._8_2_ = 0;
          auVar23._0_8_ = uVar1;
          auVar23._10_2_ = uVar26;
          auVar22._10_6_ = auVar23._10_6_;
          auVar22._8_2_ = uVar26;
          auVar22._0_8_ = uVar1;
          uVar26 = (undefined2)(uVar1 >> 0x10);
          auVar6._4_8_ = auVar22._8_8_;
          auVar6._2_2_ = uVar26;
          auVar6._0_2_ = uVar26;
          auVar25._4_4_ = auVar6._0_4_ >> 0x10;
          auVar25._12_4_ = auVar23._12_4_ >> 0x10;
          uVar2 = *(ulong *)(input + ((int)uVar9 >> 0xe) + lVar18);
          auVar3._8_4_ = 0;
          auVar3._0_8_ = uVar2;
          auVar3._12_2_ = (short)(uVar2 >> 0x30);
          auVar4._8_2_ = (short)(uVar2 >> 0x20);
          auVar4._0_8_ = uVar2;
          auVar4._10_4_ = auVar3._10_4_;
          auVar7._6_8_ = 0;
          auVar7._0_6_ = auVar4._8_6_;
          auVar5._4_2_ = (short)(uVar2 >> 0x10);
          auVar5._0_4_ = (uint)uVar2;
          auVar5._6_8_ = SUB148(auVar7 << 0x40,6);
          auVar25._0_4_ = auVar25._4_4_;
          auVar25._8_4_ = auVar25._12_4_;
          iVar8 = iVar8 + ((uint)uVar2 & 0xffff) * (int)(short)uVar1;
          iVar17 = iVar17 + auVar25._4_4_ * auVar5._4_4_;
          iVar20 = iVar20 + (int)(((ulong)auVar4._8_6_ & 0xffffffff) *
                                 (ulong)(uint)(auVar22._8_4_ >> 0x10));
          iVar21 = iVar21 + (int)((auVar25._8_8_ & 0xffffffff) * (ulong)(auVar3._10_4_ >> 0x10));
          lVar11 = lVar11 + 4;
          lVar18 = lVar18 + 4;
        } while (lVar18 != 5);
        iVar8 = iVar21 + iVar17 + iVar20 + iVar8 + 0x40 >> 7;
        if (bd == 10) {
          if (0x3fe < iVar8) {
            iVar8 = 0x3ff;
          }
        }
        else {
          if (bd == 0xc) {
            iVar17 = 0xfff;
          }
          else {
            iVar17 = 0xff;
          }
          if (iVar17 <= iVar8) {
            iVar8 = iVar17;
          }
        }
        uVar16 = (uint16_t)iVar8;
        if (iVar8 < 1) {
          uVar16 = 0;
        }
        *output = uVar16;
        output = output + 1;
        uVar9 = uVar9 + uVar12;
        bVar19 = iVar10 != iVar13;
        iVar10 = iVar10 + 1;
      } while (bVar19);
      iVar10 = iVar13 + 1;
    }
    if (iVar10 < out_length) {
      do {
        uVar16 = 0;
        lVar11 = 0;
        iVar8 = 0;
        do {
          iVar13 = ((int)uVar9 >> 0xe) + -3 + (int)lVar11;
          if (in_length + -1 <= iVar13) {
            iVar13 = in_length + -1;
          }
          iVar8 = iVar8 + (uint)input[iVar13] *
                          (int)*(short *)((long)*local_48 + lVar11 * 2 + (ulong)(uVar9 >> 4 & 0x3f0)
                                         );
          lVar11 = lVar11 + 1;
        } while (lVar11 != 8);
        iVar8 = iVar8 + 0x40 >> 7;
        if (bd == 10) {
          if (0x3fe < iVar8) {
            iVar8 = 0x3ff;
          }
        }
        else if (bd == 0xc) {
          if (0xffe < iVar8) {
            iVar8 = 0xfff;
          }
        }
        else if (0xfe < iVar8) {
          iVar8 = 0xff;
        }
        if (0 < iVar8) {
          uVar16 = (uint16_t)iVar8;
        }
        *output = uVar16;
        output = output + 1;
        iVar10 = iVar10 + 1;
        uVar9 = uVar9 + uVar12;
      } while (iVar10 != out_length);
    }
  }
  return;
}

Assistant:

static void highbd_interpolate(const uint16_t *const input, int in_length,
                               uint16_t *output, int out_length, int bd) {
  const InterpKernel *interp_filters =
      choose_interp_filter(in_length, out_length);

  highbd_interpolate_core(input, in_length, output, out_length, bd,
                          &interp_filters[0][0], SUBPEL_TAPS);
}